

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O1

void __thiscall
QPDF::insertPageobjToPage(QPDF *this,QPDFObjectHandle *obj,int pos,bool check_duplicate)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  long *plVar3;
  mapped_type *pmVar4;
  QPDFExc *this_00;
  string *filename;
  undefined7 in_register_00000009;
  size_type *psVar5;
  _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,int>,std::_Select1st<std::pair<QPDFObjGen_const,int>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,int>>>
  *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_int>_>,_bool> pVar6;
  QPDFObjGen og;
  string local_90;
  QPDFObjGen local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  local_90._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen(obj);
  this_01 = (_Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,int>,std::_Select1st<std::pair<QPDFObjGen_const,int>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,int>>>
             *)&((this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pageobj_to_pages_pos;
  local_70 = (QPDFObjGen)local_90._M_dataplus._M_p;
  if ((int)CONCAT71(in_register_00000009,check_duplicate) == 0) {
    pmVar4 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[]((map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                           *)this_01,&local_70);
    *pmVar4 = pos;
  }
  else {
    local_90._M_string_length = CONCAT44(local_90._M_string_length._4_4_,pos);
    pVar6 = std::
            _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,int>,std::_Select1st<std::pair<QPDFObjGen_const,int>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,int>>>
            ::_M_emplace_unique<std::pair<QPDFObjGen,int>>
                      (this_01,(pair<QPDFObjGen,_int> *)&local_90);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::to_string(&local_48,pos);
      std::operator+(&local_68,"page ",&local_48);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
      paVar1 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)*plVar3;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar5) {
        local_90.field_2._M_allocated_capacity = *psVar5;
        local_90.field_2._8_8_ = plVar3[3];
        local_90._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar5;
      }
      local_90._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      setLastObjectDescription(this,&local_90,local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
      filename = (string *)
                 (**(code **)(**(long **)&(((this->m)._M_t.
                                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                           _M_head_impl)->file).
                                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                             + 0x18))();
      _Var2._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"duplicate page reference found; this would cause loss of data"
                 ,"");
      QPDFExc::QPDFExc(this_00,qpdf_e_pages,filename,&(_Var2._M_head_impl)->last_object_description,
                       0,&local_90);
      __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  return;
}

Assistant:

void
QPDF::insertPageobjToPage(QPDFObjectHandle const& obj, int pos, bool check_duplicate)
{
    QPDFObjGen og(obj.getObjGen());
    if (check_duplicate) {
        if (!m->pageobj_to_pages_pos.insert(std::make_pair(og, pos)).second) {
            // The library never calls insertPageobjToPage in a way that causes this to happen.
            setLastObjectDescription("page " + std::to_string(pos) + " (numbered from zero)", og);
            throw QPDFExc(
                qpdf_e_pages,
                m->file->getName(),
                m->last_object_description,
                0,
                "duplicate page reference found; this would cause loss of data");
        }
    } else {
        m->pageobj_to_pages_pos[og] = pos;
    }
}